

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O3

void av1_foreach_transformed_block_in_plane
               (MACROBLOCKD *xd,BLOCK_SIZE plane_bsize,int plane,
               foreach_transformed_block_visitor visit,void *arg)

{
  byte bVar1;
  MB_MODE_INFO *pMVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  
  pMVar2 = *xd->mi;
  if (xd->lossless[*(ushort *)&pMVar2->field_0xa7 & 7] == 0) {
    if (plane == 0) {
      bVar6 = pMVar2->tx_size;
    }
    else {
      bVar1 = ""[av1_ss_size_lookup[pMVar2->bsize][xd->plane[plane].subsampling_x]
                 [xd->plane[plane].subsampling_y]];
      if (bVar1 < 0x11) {
        bVar6 = 3;
        if ((bVar1 - 0xb < 2) || (bVar1 == 4)) goto LAB_001a3dda;
      }
      else {
        if (bVar1 == 0x11) {
          bVar6 = 9;
          goto LAB_001a3dda;
        }
        if (bVar1 == 0x12) {
          bVar6 = 10;
          goto LAB_001a3dda;
        }
      }
      bVar6 = bVar1;
    }
  }
  else {
    bVar6 = 0;
  }
LAB_001a3dda:
  if (txsize_to_bsize[bVar6] == plane_bsize) {
    (*visit)(plane,0,0,0,plane_bsize,bVar6,arg);
  }
  else {
    uVar14 = (uint)block_size_wide[plane_bsize];
    if (xd->mb_to_right_edge < 0) {
      uVar14 = (uint)block_size_wide[plane_bsize] +
               (xd->mb_to_right_edge >> ((char)xd->plane[plane].subsampling_x + 3U & 0x1f));
    }
    uVar14 = (int)uVar14 >> 2;
    uVar17 = (uint)block_size_high[plane_bsize];
    if (xd->mb_to_bottom_edge < 0) {
      iVar16 = xd->plane[plane].subsampling_y;
      uVar17 = (uint)block_size_high[plane_bsize] +
               (xd->mb_to_bottom_edge >> ((char)iVar16 + 3U & 0x1f));
    }
    else {
      iVar16 = xd->plane[plane].subsampling_y;
    }
    uVar17 = (int)uVar17 >> 2;
    bVar1 = *(byte *)((long)iVar16 + (long)xd->plane[plane].subsampling_x * 2 + 0x511f90);
    uVar12 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [bVar1];
    if ((int)uVar14 <
        (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [bVar1]) {
      uVar12 = uVar14;
    }
    uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [bVar1];
    if ((int)uVar17 <
        (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [bVar1]) {
      uVar7 = uVar17;
    }
    if (0 < (int)uVar17) {
      uVar15 = (uint)*(byte *)((long)tx_size_high_unit + (ulong)((uint)bVar6 * 4));
      uVar13 = (uint)*(byte *)((long)tx_size_wide_unit + (ulong)((uint)bVar6 * 4));
      iVar16 = 0;
      uVar8 = 0;
      do {
        uVar9 = uVar7 + uVar8;
        uVar18 = uVar17;
        if ((int)uVar9 < (int)uVar17) {
          uVar18 = uVar9;
        }
        if (0 < (int)uVar14) {
          uVar10 = 0;
          do {
            uVar11 = uVar12 + uVar10;
            uVar5 = uVar8;
            uVar3 = uVar14;
            if ((int)uVar11 < (int)uVar14) {
              uVar3 = uVar11;
            }
            for (; uVar4 = uVar10, (int)uVar5 < (int)uVar18; uVar5 = uVar5 + uVar15) {
              for (; (int)uVar4 < (int)uVar3; uVar4 = uVar4 + uVar13) {
                (*visit)(plane,iVar16,uVar5,uVar4,plane_bsize,bVar6,arg);
                iVar16 = iVar16 + uVar15 * uVar13;
              }
            }
            uVar10 = uVar11;
          } while ((int)uVar11 < (int)uVar14);
        }
        uVar8 = uVar9;
      } while ((int)uVar9 < (int)uVar17);
    }
  }
  return;
}

Assistant:

void av1_foreach_transformed_block_in_plane(
    const MACROBLOCKD *const xd, BLOCK_SIZE plane_bsize, int plane,
    foreach_transformed_block_visitor visit, void *arg) {
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  // block and transform sizes, in number of 4x4 blocks log 2 ("*_b")
  // 4x4=0, 8x8=2, 16x16=4, 32x32=6, 64x64=8
  // transform size varies per plane, look it up in a common way.
  const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
  const BLOCK_SIZE tx_bsize = txsize_to_bsize[tx_size];
  // Call visit() directly with zero offsets if the current block size is the
  // same as the transform block size.
  if (plane_bsize == tx_bsize) {
    visit(plane, 0, 0, 0, plane_bsize, tx_size, arg);
    return;
  }
  const uint8_t txw_unit = tx_size_wide_unit[tx_size];
  const uint8_t txh_unit = tx_size_high_unit[tx_size];
  const int step = txw_unit * txh_unit;

  // If mb_to_right_edge is < 0 we are in a situation in which
  // the current block size extends into the UMV and we won't
  // visit the sub blocks that are wholly within the UMV.
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const BLOCK_SIZE max_unit_bsize =
      get_plane_block_size(BLOCK_64X64, pd->subsampling_x, pd->subsampling_y);
  const int mu_blocks_wide =
      AOMMIN(mi_size_wide[max_unit_bsize], max_blocks_wide);
  const int mu_blocks_high =
      AOMMIN(mi_size_high[max_unit_bsize], max_blocks_high);

  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  int i = 0;
  for (int r = 0; r < max_blocks_high; r += mu_blocks_high) {
    const int unit_height = AOMMIN(mu_blocks_high + r, max_blocks_high);
    // Skip visiting the sub blocks that are wholly within the UMV.
    for (int c = 0; c < max_blocks_wide; c += mu_blocks_wide) {
      const int unit_width = AOMMIN(mu_blocks_wide + c, max_blocks_wide);
      for (int blk_row = r; blk_row < unit_height; blk_row += txh_unit) {
        for (int blk_col = c; blk_col < unit_width; blk_col += txw_unit) {
          visit(plane, i, blk_row, blk_col, plane_bsize, tx_size, arg);
          i += step;
        }
      }
    }
  }
  // Check if visit() is invoked at least once.
  assert(i >= 1);
}